

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV AsymSign(Session *session,CK_BYTE_PTR pData,CK_ULONG ulDataLen,CK_BYTE_PTR pSignature,
              CK_ULONG_PTR pulSignatureLen)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  uchar *__src;
  void *in_RCX;
  Session *in_RDI;
  ulong *in_R8;
  ByteString signature;
  ByteString data;
  CK_ULONG size;
  void *param;
  size_t paramLen;
  PrivateKey *privateKey;
  Type mechanism;
  AsymmetricAlgorithm *asymCrypto;
  ByteString *in_stack_fffffffffffffee8;
  Session *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  ByteString *in_stack_ffffffffffffff00;
  ByteString *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff11;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  undefined4 in_stack_ffffffffffffff14;
  undefined1 local_e8 [96];
  undefined1 local_88 [40];
  ulong local_60;
  void *local_58;
  ByteString *local_50;
  PrivateKey *local_48;
  Type local_3c;
  AsymmetricAlgorithm *local_38;
  ulong *local_30;
  void *local_28;
  Session *local_10;
  CK_RV local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  local_38 = Session::getAsymmetricCryptoOp(in_RDI);
  local_3c = Session::getMechanism(local_10);
  local_48 = Session::getPrivateKey(local_10);
  local_58 = Session::getParameters(local_10,(size_t *)&local_50);
  if (((local_38 == (AsymmetricAlgorithm *)0x0) ||
      (bVar1 = Session::getAllowSinglePartOp(local_10), !bVar1)) || (local_48 == (PrivateKey *)0x0))
  {
    Session::resetOp(in_stack_fffffffffffffef0);
    return 0x91;
  }
  bVar1 = Session::getReAuthentication(local_10);
  if (bVar1) {
    Session::resetOp(in_stack_fffffffffffffef0);
    return 0x101;
  }
  iVar2 = (*(local_48->super_Serialisable)._vptr_Serialisable[5])();
  local_60 = CONCAT44(extraout_var,iVar2);
  if (local_28 == (void *)0x0) {
    *local_30 = local_60;
    return 0;
  }
  if (*local_30 < local_60) {
    *local_30 = local_60;
    return 0x150;
  }
  ByteString::ByteString((ByteString *)0x17053d);
  if (local_3c == RSA) {
    ByteString::wipe(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  ByteString::ByteString
            ((ByteString *)
             CONCAT44(in_stack_ffffffffffffff14,
                      CONCAT13(in_stack_ffffffffffffff13,
                               CONCAT12(in_stack_ffffffffffffff12,
                                        CONCAT11(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10
                                                )))),(uchar *)in_stack_ffffffffffffff08,
             (size_t)in_stack_ffffffffffffff00);
  ByteString::operator+=
            ((ByteString *)
             CONCAT44(in_stack_ffffffffffffff14,
                      CONCAT13(in_stack_ffffffffffffff13,
                               CONCAT12(in_stack_ffffffffffffff12,
                                        CONCAT11(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10
                                                )))),in_stack_ffffffffffffff08);
  ByteString::~ByteString((ByteString *)0x1705be);
  ByteString::ByteString((ByteString *)0x1705c8);
  bVar1 = Session::getAllowMultiPartOp(local_10);
  if (bVar1) {
    uVar3 = (*local_38->_vptr_AsymmetricAlgorithm[4])(local_38,local_88);
    if (((uVar3 & 1) == 0) ||
       (uVar3 = (*local_38->_vptr_AsymmetricAlgorithm[5])(local_38,local_e8), (uVar3 & 1) == 0)) {
      Session::resetOp(in_stack_fffffffffffffef0);
      local_8 = 5;
      goto LAB_001707ff;
    }
  }
  else {
    uVar3 = (*local_38->_vptr_AsymmetricAlgorithm[2])
                      (local_38,local_48,local_88,local_e8,(ulong)local_3c,local_58);
    in_stack_fffffffffffffee8 = local_50;
    if ((uVar3 & 1) == 0) {
      Session::resetOp(in_stack_fffffffffffffef0);
      local_8 = 5;
      goto LAB_001707ff;
    }
  }
  sVar4 = ByteString::size((ByteString *)0x170731);
  if (sVar4 == local_60) {
    __src = ByteString::byte_str(in_stack_fffffffffffffee8);
    memcpy(local_28,__src,local_60);
    *local_30 = local_60;
    Session::resetOp(in_stack_fffffffffffffef0);
    local_8 = 0;
  }
  else {
    softHSMLog(3,"AsymSign",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1228,"The size of the signature differs from the size of the mechanism");
    Session::resetOp(in_stack_fffffffffffffef0);
    local_8 = 5;
  }
LAB_001707ff:
  ByteString::~ByteString((ByteString *)0x170809);
  ByteString::~ByteString((ByteString *)0x170816);
  return local_8;
}

Assistant:

static CK_RV AsymSign(Session* session, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pSignature, CK_ULONG_PTR pulSignatureLen)
{
	AsymmetricAlgorithm* asymCrypto = session->getAsymmetricCryptoOp();
	AsymMech::Type mechanism = session->getMechanism();
	PrivateKey* privateKey = session->getPrivateKey();
	size_t paramLen;
	void* param = session->getParameters(paramLen);
	if (asymCrypto == NULL || !session->getAllowSinglePartOp() || privateKey == NULL)
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Check if re-authentication is required
	if (session->getReAuthentication())
	{
		session->resetOp();
		return CKR_USER_NOT_LOGGED_IN;
	}

	// Size of the signature
	CK_ULONG size = privateKey->getOutputLength();
	if (pSignature == NULL_PTR)
	{
		*pulSignatureLen = size;
		return CKR_OK;
	}

	// Check buffer size
	if (*pulSignatureLen < size)
	{
		*pulSignatureLen = size;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the data
	ByteString data;

	// We must allow input length <= k and therfore need to prepend the data with zeroes.
	if (mechanism == AsymMech::RSA) {
		data.wipe(size-ulDataLen);
	}

	data += ByteString(pData, ulDataLen);
	ByteString signature;

	// Sign the data
	if (session->getAllowMultiPartOp())
	{
		if (!asymCrypto->signUpdate(data) ||
		    !asymCrypto->signFinal(signature))
		{
			session->resetOp();
			return CKR_GENERAL_ERROR;
		}
	}
	else if (!asymCrypto->sign(privateKey,data,signature,mechanism,param,paramLen))
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	// Check size
	if (signature.size() != size)
	{
		ERROR_MSG("The size of the signature differs from the size of the mechanism");
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	memcpy(pSignature, signature.byte_str(), size);
	*pulSignatureLen = size;

	session->resetOp();
	return CKR_OK;
}